

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonReporter::testRunEnded(JsonReporter *this,TestRunStats *runStats)

{
  _Elt_pointer pJVar1;
  JsonObjectWriter local_1e0;
  JsonObjectWriter totals;
  JsonValueWriter local_1b0;
  
  endArray(this);
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,(int)pJVar1 + -0x18,"totals",6);
  JsonValueWriter::writeObject(&totals,&local_1b0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,(int)&totals,"assertions",10);
  JsonValueWriter::writeObject(&local_1e0,&local_1b0);
  writeCounts(&local_1e0,&(runStats->totals).assertions);
  JsonObjectWriter::~JsonObjectWriter(&local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,(int)&totals,"test-cases",10);
  JsonValueWriter::writeObject(&local_1e0,&local_1b0);
  writeCounts(&local_1e0,&(runStats->totals).testCases);
  JsonObjectWriter::~JsonObjectWriter(&local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  JsonObjectWriter::~JsonObjectWriter(&totals);
  endObject(this);
  return;
}

Assistant:

void JsonReporter::testRunEnded(TestRunStats const& runStats) {
        assert( isInside( Writer::Array ) );
        // End "test-cases"
        endArray();

        {
            auto totals =
                m_objectWriters.top().write( "totals"_sr ).writeObject();
            writeCounts( totals.write( "assertions"_sr ).writeObject(),
                         runStats.totals.assertions );
            writeCounts( totals.write( "test-cases"_sr ).writeObject(),
                         runStats.totals.testCases );
        }

        // End the "test-run" object
        endObject();
    }